

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O2

void print_statdiff(char *prefix,char *fmt,long oldv,long newv)

{
  attr_t attr;
  wchar_t col;
  
  if ((prefix != (char *)0x0) && (*prefix != '\0')) {
    waddnstr(statuswin,prefix,0xffffffffffffffff);
  }
  status_change_color_on(&col,&attr,oldv,0,newv,0);
  wprintw(statuswin,fmt,newv);
  status_change_color_off(col,attr);
  return;
}

Assistant:

static void print_statdiff(const char *prefix, const char *fmt,
			   long oldv, long newv)
{
    int col;
    attr_t attr;

    if (prefix && prefix[0])
	waddstr(statuswin, prefix);
    status_change_color_on(&col, &attr, oldv, 0, newv, 0);
    wprintw(statuswin, fmt, newv);
    status_change_color_off(col, attr);
}